

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

void curl_global_cleanup(void)

{
  if ((initialized != 0) && (initialized = initialized - 1, initialized == 0)) {
    if (host_cache_initialized == '\x01') {
      Curl_hash_clean_with_criterium(&hostname_cache,(void *)0x0,hostcache_inuse);
      Curl_hash_clean(&hostname_cache);
      host_cache_initialized = '\0';
    }
    return;
  }
  return;
}

Assistant:

void curl_global_cleanup(void)
{
  if(!initialized)
    return;

  if(--initialized)
    return;

  Curl_global_host_cache_dtor();

  if(init_flags & CURL_GLOBAL_SSL)
    Curl_ssl_cleanup();

  Curl_resolver_global_cleanup();

  if(init_flags & CURL_GLOBAL_WIN32)
    win32_cleanup();

  Curl_amiga_cleanup();

#if defined(USE_LIBSSH2) && defined(HAVE_LIBSSH2_EXIT)
  (void)libssh2_exit();
#endif

  init_flags  = 0;
}